

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::UninterpretedOption_NamePart::SerializeWithCachedSizesToArray
          (UninterpretedOption_NamePart *this,uint8 *target)

{
  bool bVar1;
  string *psVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  uint32 value;
  uint8 *puVar4;
  
  if ((this->_has_bits_[0] & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_part_->_M_dataplus)._M_p,(int)this->name_part_->_M_string_length,
               SERIALIZE);
    psVar2 = this->name_part_;
    *target = '\n';
    value = (uint32)psVar2->_M_string_length;
    if (value < 0x80) {
      target[1] = (uint8)psVar2->_M_string_length;
      puVar4 = target + 2;
    }
    else {
      puVar4 = io::CodedOutputStream::WriteVarint32FallbackToArray(value,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,puVar4);
  }
  if ((this->_has_bits_[0] & 2) != 0) {
    bVar1 = this->is_extension_;
    *target = '\x10';
    target[1] = bVar1;
    target = target + 2;
  }
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar4 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar4;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* UninterpretedOption_NamePart::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // required string name_part = 1;
  if (has_name_part()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name_part().data(), this->name_part().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name_part(), target);
  }

  // required bool is_extension = 2;
  if (has_is_extension()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->is_extension(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}